

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void __thiscall groundupdb::HashedValue::HashedValue(HashedValue *this,EncodedValue *from)

{
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
  this->m_has_value = from->m_has_value;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&this->m_data,&(from->m_value).m_data);
  this->m_length = (from->m_value).m_length;
  this->m_hash = (from->m_value).m_hash;
  return;
}

Assistant:

HashedValue::HashedValue(const EncodedValue& from)
  : m_has_value(from.hasValue()),
    m_data(from.data()),
    m_length(from.length()),
    m_hash(from.hash())
{
  ;
}